

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

bool __thiscall
clipp::parser::try_match_full<clipp::detail::select_values>
          (parser *this,arg_string *arg,select_values *select)

{
  bool bVar1;
  scoped_dfs_traverser local_188;
  undefined1 local_e8 [8];
  match_t match;
  select_values *select_local;
  arg_string *arg_local;
  parser *this_local;
  
  match.pos_._152_8_ = select;
  detail::scoped_dfs_traverser::scoped_dfs_traverser(&local_188,&this->pos_);
  detail::full_match<clipp::detail::select_values>
            ((match_t *)local_e8,&local_188,arg,(select_values *)match.pos_._152_8_);
  detail::scoped_dfs_traverser::~scoped_dfs_traverser(&local_188);
  bVar1 = detail::match_t::operator_cast_to_bool((match_t *)local_e8);
  if (bVar1) {
    add_match(this,(match_t *)local_e8);
  }
  detail::match_t::~match_t((match_t *)local_e8);
  return bVar1;
}

Assistant:

bool try_match_full(const arg_string& arg, const ParamSelector& select)
    {
        auto match = detail::full_match(pos_, arg, select);
        if(!match) return false;
        add_match(match);
        return true;
    }